

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

void recff_cdata_call(jit_State *J,RecordFFData *rd)

{
  CTSize *pCVar1;
  TRef *pTVar2;
  byte bVar3;
  CType *pCVar4;
  lua_State *plVar5;
  TValue *pTVar6;
  TValue *pTVar7;
  BCIns *pBVar8;
  TRef *pTVar9;
  CTypeID id;
  TRef TVar10;
  CTypeID id_00;
  IRType IVar11;
  uint uVar12;
  uint uVar13;
  TRef TVar14;
  GCcdata *cd;
  GCcdata GVar15;
  cTValue *pcVar16;
  IRRef1 IVar17;
  BCIns *pBVar18;
  MMS mm;
  uint uVar19;
  short sVar20;
  lua_State *L;
  CTState *cts;
  ushort uVar21;
  CTState *cts_00;
  ulong uVar22;
  TValue *base;
  CType *pCVar23;
  BCReg BVar24;
  CType *d;
  ulong uVar25;
  bool bVar26;
  IRRef1 local_f4;
  cTValue local_c0;
  TRef local_b8;
  TRef local_b4 [33];
  
  cts = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
  cd = argv2cdata(J,*J->base,rd->argv);
  uVar21 = cd->ctypeid;
  if (uVar21 == 0x15) {
    id_00 = crec_constructor(J,cd,*J->base);
    mm = MM_new;
LAB_0015823b:
    uVar12 = cts->tab[id_00].info;
    id = uVar12 & 0xffff;
    if ((uVar12 & 0xf0000000) != 0x20000000) {
      id = id_00;
    }
    pcVar16 = lj_ctype_meta(cts,id,mm);
    if (pcVar16 == (cTValue *)0x0) {
      if (uVar21 == 0x15) {
        crec_alloc(J,rd,id_00);
        return;
      }
    }
    else if ((pcVar16->field_2).it == 0xfffffff7) {
      TVar14 = lj_ir_kgc(J,(GCobj *)(ulong)(pcVar16->u32).lo,IRT_FUNC);
      J->base[-1] = TVar14 | 0x10000;
      rd->nres = -1;
      return;
    }
    lj_trace_err(J,LJ_TRERR_BADTYPE);
  }
  cts_00 = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
  pCVar4 = cts_00->tab;
  pCVar23 = pCVar4 + uVar21;
  if ((pCVar4[uVar21].info & 0xf0000000) == 0x20000000) {
    pCVar1 = &pCVar23->size;
    pCVar23 = pCVar4 + (ushort)pCVar23->info;
    sVar20 = (ushort)(*pCVar1 == 8) * 4 + 5;
  }
  else {
    sVar20 = 9;
  }
  mm = MM_call;
  if ((pCVar23->info & 0xf0000000) != 0x60000000) {
    id_00 = (CTypeID)uVar21;
    goto LAB_0015823b;
  }
  TVar14 = *J->base;
  (J->fold).ins.field_0.ot = sVar20 + 0x4400;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
  (J->fold).ins.field_0.op2 = 0xf;
  TVar14 = lj_opt_fold(J);
  local_f4 = (IRRef1)TVar14;
  pCVar4 = cts_00->tab + (ushort)pCVar23->info;
  IVar11 = crec_ct2irt(cts_00,pCVar4);
  if (sVar20 == 9) {
    GVar15 = cd[1];
  }
  else {
    GVar15.marked = '\0';
    GVar15.gct = '\0';
    GVar15.ctypeid = 0;
    GVar15.nextgc.gcptr32 = cd[1].nextgc.gcptr32;
  }
  local_c0.u64 = (ulong)GVar15 >> 2;
  pcVar16 = lj_tab_get(J->L,cts_00->miscmap,&local_c0);
  if ((pcVar16->field_2).it == 0xfffffffd) {
    lj_trace_err(J,LJ_TRERR_BLACKL);
  }
  uVar12 = pCVar4->info >> 0x1c;
  if (uVar12 == 4) {
    rd->nres = 0;
    IVar11 = IRT_NIL;
  }
  else if (((uVar12 != 2 && 0xfffffff < pCVar4->info) && (uVar12 != 5)) || (IVar11 == IRT_CDATA))
  goto LAB_0015834c;
  if ((pCVar23->info & 0x800000) != 0) {
    TVar14 = lj_ir_kint(J,(int32_t)((ulong)((long)pCVar23 - (long)cts_00->tab) >> 4));
    (J->fold).ins.field_0.ot = 0x6200;
    (J->fold).ins.field_0.op1 = local_f4;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar14;
    TVar14 = lj_opt_fold(J);
    local_f4 = (IRRef1)TVar14;
  }
  uVar21 = (ushort)IVar11;
  uVar12 = (uint)pCVar23->sib;
  uVar22 = 0;
  if (uVar12 == 0) {
    uVar12 = 0;
  }
  local_b8 = 0x7fff;
  if (J->base[1] != 0) {
    pcVar16 = rd->argv;
    uVar22 = 0;
    pTVar9 = J->base;
    do {
      if (uVar22 == 0x20) goto LAB_0015834c;
      pcVar16 = pcVar16 + 1;
      if (uVar12 == 0) {
        if ((pCVar23->info & 0x800000) == 0) goto LAB_0015834c;
        uVar13 = lj_ccall_ctid_vararg(cts_00,pcVar16);
        uVar12 = 0;
      }
      else {
        uVar13 = (uint)(ushort)cts_00->tab[uVar12].info;
        uVar12 = (uint)cts_00->tab[uVar12].sib;
      }
      uVar19 = cts_00->tab[uVar13].info;
      if (((0xfffffff < uVar19) && (uVar19 = uVar19 >> 0x1c, uVar19 != 2)) && (uVar19 != 5))
      goto LAB_0015834c;
      d = cts_00->tab + uVar13;
      TVar14 = crec_ct_tv(J,d,0,pTVar9[1],pcVar16);
      uVar13 = d->info;
      if (((uVar13 & 0xf4000000) == 0) && (d->size < 4)) {
        bVar26 = d->size != 1;
        (J->fold).ins.field_0.ot = 0x5913;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
        IVar17 = bVar26 + 0x270 + (ushort)bVar26;
        if ((uVar13 >> 0x17 & 1) == 0) {
          IVar17 = bVar26 + 0xa6f + (ushort)bVar26;
        }
        (J->fold).ins.field_0.op2 = IVar17;
        TVar14 = lj_opt_fold(J);
      }
      local_b4[uVar22 - 1] = TVar14;
      uVar22 = uVar22 + 1;
      pTVar2 = pTVar9 + 2;
      pTVar9 = pTVar9 + 1;
    } while (*pTVar2 != 0);
  }
  IVar17 = (IRRef1)local_b8;
  if (1 < (uint)uVar22) {
    uVar25 = 1;
    TVar14 = local_b8;
    do {
      TVar10 = local_b4[uVar25 - 1];
      (J->fold).ins.field_0.ot = 0x6200;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
      TVar14 = lj_opt_fold(J);
      IVar17 = (IRRef1)TVar14;
      uVar25 = uVar25 + 1;
    } while ((uVar22 & 0xffffffff) != uVar25);
  }
  (J->fold).ins.field_0.ot = uVar21 | 0x6100;
  (J->fold).ins.field_0.op1 = IVar17;
  (J->fold).ins.field_0.op2 = local_f4;
  TVar14 = lj_opt_fold(J);
  IVar17 = (IRRef1)TVar14;
  if ((pCVar4->info & 0xf8000000) == 0x8000000) {
    plVar5 = J->L;
    pTVar6 = plVar5->base;
    uVar12 = *(uint *)((long)pTVar6 + -4);
    pBVar18 = (BCIns *)(ulong)uVar12;
    if (((uVar12 & 3) != 0) || (TVar14 = 0x7fff, *(char *)((long)pBVar18 - 1) != '\x01')) {
      if (((uVar12 & 3) != 0) || (J->framedepth < 1)) {
LAB_0015834c:
        lj_trace_err(J,LJ_TRERR_NYICALL);
      }
      pTVar7 = plVar5->top;
      pBVar8 = J->pc;
      pTVar9 = J->base;
      TVar14 = pTVar9[-1];
      J->pc = pBVar18;
      bVar3 = *(byte *)((long)pBVar18 - 3);
      plVar5->top = pTVar6;
      uVar22 = (ulong)((uint)bVar3 * 4 + 4);
      BVar24 = bVar3 + 1;
      plVar5->base = (TValue *)((long)pTVar6 - (ulong)((uint)bVar3 * 8 + 8));
      pTVar9[-1] = 0x1007ffe;
      J->base = (TRef *)((long)pTVar9 - uVar22);
      J->baseslot = J->baseslot - BVar24;
      J->maxslot = BVar24;
      J->framedepth = J->framedepth + -1;
      lj_snap_add(J);
      plVar5->base = pTVar6;
      plVar5->top = pTVar7;
      J->framedepth = J->framedepth + 1;
      J->maxslot = 1;
      pTVar9 = J->base;
      J->base = (TRef *)((long)pTVar9 + uVar22);
      J->baseslot = J->baseslot + BVar24;
      *(TRef *)((long)pTVar9 + (uVar22 - 4)) = TVar14;
      J->pc = pBVar8;
      TVar14 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.ot = 0x990;
      (J->fold).ins.field_0.op1 = IVar17;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar14;
      J->postproc = LJ_POST_FIXGUARDSNAP;
      TVar14 = 0x2007ffd;
    }
    goto LAB_0015820a;
  }
  if (((IVar11 < IRT_SOFTFP) && ((0x600220U >> (IVar11 & IRT_TYPE) & 1) != 0)) ||
     ((pCVar4->info & 0xf0000000) == 0x50000000)) {
    TVar14 = lj_ir_kint(J,(uint)(ushort)pCVar23->info);
    (J->fold).ins.field_0.ot = 0x528a;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
    (J->fold).ins.field_0.op2 = IVar17;
  }
  else {
    switch(IVar11) {
    case IRT_FLOAT:
    case IRT_U32:
      uVar21 = uVar21 | 0x1c0;
      (J->fold).ins.field_0.ot = 0x590e;
      goto LAB_00158319;
    default:
      if ((IVar11 & ~IRT_TRUE) != IRT_U8) goto LAB_0015820a;
      uVar21 = uVar21 | 0x260;
      break;
    case IRT_I8:
    case IRT_I16:
      uVar21 = uVar21 | 0xa60;
    }
    (J->fold).ins.field_0.ot = 0x5913;
LAB_00158319:
    (J->fold).ins.field_0.op1 = IVar17;
    (J->fold).ins.field_0.op2 = uVar21;
  }
  TVar14 = lj_opt_fold(J);
LAB_0015820a:
  *J->base = TVar14;
  J->needsnap = '\x01';
  return;
}

Assistant:

void LJ_FASTCALL recff_cdata_call(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  GCcdata *cd = argv2cdata(J, J->base[0], &rd->argv[0]);
  CTypeID id = cd->ctypeid;
  CType *ct;
  cTValue *tv;
  MMS mm = MM_call;
  if (id == CTID_CTYPEID) {
    id = crec_constructor(J, cd, J->base[0]);
    mm = MM_new;
  } else if (crec_call(J, rd, cd)) {
    return;
  }
  /* Record ctype __call/__new metamethod. */
  ct = ctype_raw(cts, id);
  tv = lj_ctype_meta(cts, ctype_isptr(ct->info) ? ctype_cid(ct->info) : id, mm);
  if (tv) {
    if (tvisfunc(tv)) {
      crec_tailcall(J, rd, tv);
      return;
    }
  } else if (mm == MM_new) {
    crec_alloc(J, rd, id);
    return;
  }
  /* No metamethod or NYI: non-function metamethods. */
  lj_trace_err(J, LJ_TRERR_BADTYPE);
}